

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O1

void __thiscall
QOpenGL2PaintEngineExPrivate::stroke(QOpenGL2PaintEngineExPrivate *this,QVectorPath *path,QPen *pen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  QOpenGLEngineShaderManager *this_00;
  float *data;
  int iVar4;
  int iVar5;
  double dVar6;
  bool bVar7;
  qsizetype qVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  socklen_t __len;
  sockaddr *__addr;
  double *pdVar12;
  long in_FS_OFFSET;
  ulong uVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 local_e8;
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  QRectF local_b8;
  QBrush local_90 [8];
  undefined1 local_88 [8];
  undefined8 uStack_80;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  CacheEntry *local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->q->field_0x8;
  lVar11 = lVar3 + -8;
  if (lVar3 == 0) {
    lVar11 = 0;
  }
  if (this->snapToPixelGrid == true) {
    this->snapToPixelGrid = false;
    this->matrixDirty = true;
  }
  iVar10 = *(int *)(*(long *)pen + 0x18);
  QBrush::QBrush(local_90,(QBrush *)(*(long *)pen + 0x10));
  cVar9 = QBrush::isOpaque();
  if (cVar9 == '\0') {
    bVar7 = false;
  }
  else {
    bVar7 = 0.99 < *(double *)(lVar11 + 0x198);
  }
  if (this->mode != BrushDrawingMode) {
    this_00 = this->shaderManager;
    this_00->shaderProgNeedsChanging = true;
    this_00->complexGeometry = false;
    QOpenGLEngineShaderManager::setMaskType((QOpenGLEngineShaderManager *)this_00,NoMask);
    this->mode = BrushDrawingMode;
  }
  updateMatrix(this);
  local_b8.w._0_4_ = 0xffffffff;
  local_b8.w._4_4_ = 0xffffffff;
  local_b8.h._0_4_ = 0xffffffff;
  local_b8.h._4_4_ = 0xffffffff;
  local_b8.xp._0_4_ = 0xffffffff;
  local_b8.xp._4_4_ = 0xffffffff;
  local_b8.yp._0_4_ = 0xffffffff;
  local_b8.yp._4_4_ = 0xffffffff;
  QTransform::inverted((bool *)local_88);
  lVar3 = *(long *)&this->q->field_0x8;
  lVar11 = lVar3 + -8;
  if (lVar3 == 0) {
    lVar11 = 0;
  }
  if ((*(byte *)(lVar11 + 0x1a0) & 4) == 0) {
    local_d8 = (undefined1  [16])0x0;
    uVar1 = this->width;
    uVar2 = this->height;
    local_c8 = (double)(int)uVar1;
    dStack_c0 = (double)(int)uVar2;
  }
  else {
    iVar4 = (int)*(undefined8 *)(lVar11 + 0x1c4);
    iVar5 = (int)((ulong)*(undefined8 *)(lVar11 + 0x1c4) >> 0x20);
    dVar6 = (double)iVar5;
    local_d8._8_4_ = SUB84(dVar6,0);
    local_d8._0_8_ = (double)iVar4;
    local_d8._12_4_ = (int)((ulong)dVar6 >> 0x20);
    local_c8 = (double)(((long)*(int *)(lVar11 + 0x1cc) - (long)iVar4) + 1);
    dStack_c0 = (double)(((long)*(int *)(lVar11 + 0x1d0) - (long)iVar5) + 1);
  }
  QTransform::mapRect(&local_b8);
  if (iVar10 == 1) {
    __len = (socklen_t)&local_b8;
    QTriangulatingStroker::process(&this->stroker,path,pen);
  }
  else {
    QDashedStrokeProcessor::process(&this->dasher,path,pen,&local_b8);
    uStack_70 = 0xffffffff;
    uStack_6c = 0xffffffff;
    uStack_68 = 0xffffffff;
    uStack_64 = 0xffffffff;
    local_60 = 0xffffffff;
    uStack_5c = 0xffffffff;
    uStack_58 = 0xffffffff;
    uStack_54 = 0xffffffff;
    local_50 = (CacheEntry *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_80 = *(qreal **)&this->field_0x4a8;
    local_88 = *(undefined1 (*) [8])&this->field_0x4c0;
    local_78 = (double)CONCAT44(7,*(undefined4 *)&this->field_0x4b8);
    __len = (socklen_t)&local_b8;
    QTriangulatingStroker::process(&this->stroker,(QVectorPath *)local_88,pen);
    QVectorPath::~QVectorPath((QVectorPath *)local_88);
  }
  if ((int)(this->stroker).m_vertices.siz != 0) {
    if (bVar7) {
      iVar10 = 1;
      prepareForDraw(this,true);
      data = (this->stroker).m_vertices.buffer;
      qVar8 = (this->stroker).m_vertices.siz;
      QOpenGLBuffer::bind(&this->vertexBuffer,iVar10,__addr,__len);
      QOpenGLBuffer::allocate(&this->vertexBuffer,data,(int)qVar8 << 2);
      (**(code **)(*(long *)&this->funcs + 0x468))(0,2,0x1406,0,0,0);
      (**(code **)(*(long *)&this->funcs + 0x78))(5,0,(int)(this->stroker).m_vertices.siz / 2);
    }
    else {
      dVar6 = *(double *)(*(long *)pen + 8) * 0.5;
      uVar13 = -(ulong)(dVar6 == 0.0);
      dVar6 = (double)(uVar13 & 0x3fe0000000000000 | ~uVar13 & (ulong)dVar6);
      local_d8._0_8_ = dVar6;
      iVar10 = QPen::joinStyle();
      pdVar12 = (double *)local_d8;
      if (iVar10 == 0) {
        dVar15 = (double)QPen::miterLimit();
        local_88 = (undefined1  [8])(dVar15 * dVar6);
        pdVar12 = (double *)local_88;
        if ((double)(dVar15 * dVar6) < dVar6) {
          pdVar12 = (double *)local_d8;
        }
      }
      dVar6 = *pdVar12;
      cVar9 = QPen::isCosmetic();
      if (cVar9 != '\0') {
        dVar6 = dVar6 * (double)this->inverseScale;
      }
      QVectorPath::controlPointRect();
      fVar17 = (float)((double)local_88 - dVar6);
      fVar18 = (float)((double)uStack_80 - dVar6);
      fVar14 = (float)(local_78 + dVar6 + dVar6 + ((double)local_88 - dVar6));
      fVar16 = (float)((double)CONCAT44(uStack_6c,uStack_70) + dVar6 + dVar6 +
                      ((double)uStack_80 - dVar6));
      local_e8 = (ElementType *)CONCAT44(fVar18,fVar17);
      local_88._4_4_ = fVar18;
      local_88._0_4_ = fVar17;
      uStack_80 = (qreal *)CONCAT44(fVar16,fVar14);
      fillStencilWithVertexArray
                (this,(this->stroker).m_vertices.buffer,(int)(this->stroker).m_vertices.siz / 2,
                 (int *)0x0,0,(QOpenGLRect *)local_88,TriStripStrokeFillMode);
      (**(code **)(*(long *)&this->funcs + 0x138))(0x1e00,0x1e01,0x1e01);
      (**(code **)(*(long *)&this->funcs + 0x128))(0x205,0,0x80);
      prepareForDraw(this,false);
      uStack_80 = (qreal *)CONCAT44(fVar16,fVar14);
      local_88 = (undefined1  [8])local_e8;
      composite(this,(QOpenGLRect *)local_88);
      (**(code **)(*(long *)&this->funcs + 0x130))(0);
      updateClipScissorTest(this);
    }
  }
  QBrush::~QBrush(local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::stroke(const QVectorPath &path, const QPen &pen)
{
    const QOpenGL2PaintEngineState *s = q->state();
    if (snapToPixelGrid) {
        snapToPixelGrid = false;
        matrixDirty = true;
    }

    const Qt::PenStyle penStyle = qpen_style(pen);
    const QBrush &penBrush = qpen_brush(pen);
    const bool opaque = penBrush.isOpaque() && s->opacity > 0.99;

    transferMode(BrushDrawingMode);

    // updateMatrix() is responsible for setting the inverse scale on
    // the strokers, so we need to call it here and not wait for
    // prepareForDraw() down below.
    updateMatrix();

    QRectF clip = q->state()->matrix.inverted().mapRect(q->state()->clipEnabled
                                                        ? q->state()->rectangleClip
                                                        : QRectF(0, 0, width, height));

    if (penStyle == Qt::SolidLine) {
        stroker.process(path, pen, clip, s->renderHints);

    } else { // Some sort of dash
        dasher.process(path, pen, clip, s->renderHints);

        QVectorPath dashStroke(dasher.points(),
                               dasher.elementCount(),
                               dasher.elementTypes());
        stroker.process(dashStroke, pen, clip, s->renderHints);
    }

    if (!stroker.vertexCount())
        return;

    if (opaque) {
        prepareForDraw(opaque);

        uploadData(QT_VERTEX_COORDS_ATTR, stroker.vertices(), stroker.vertexCount());
        funcs.glDrawArrays(GL_TRIANGLE_STRIP, 0, stroker.vertexCount() / 2);
    } else {
        qreal width = qpen_widthf(pen) / 2;
        if (width == 0)
            width = 0.5;
        qreal extra = pen.joinStyle() == Qt::MiterJoin
                      ? qMax(pen.miterLimit() * width, width)
                      : width;

        if (pen.isCosmetic())
            extra = extra * inverseScale;

        QRectF bounds = path.controlPointRect().adjusted(-extra, -extra, extra, extra);

        fillStencilWithVertexArray(stroker.vertices(), stroker.vertexCount() / 2,
                                      nullptr, 0, bounds, QOpenGL2PaintEngineExPrivate::TriStripStrokeFillMode);

        funcs.glStencilOp(GL_KEEP, GL_REPLACE, GL_REPLACE);

        // Pass when any bit is set, replace stencil value with 0
        funcs.glStencilFunc(GL_NOTEQUAL, 0, GL_STENCIL_HIGH_BIT);
        prepareForDraw(false);

        // Stencil the brush onto the dest buffer
        composite(bounds);

        funcs.glStencilMask(0);

        updateClipScissorTest();
    }
}